

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

void __thiscall wabt::WastParser::ErrorUnlessOpcodeEnabled(WastParser *this,Token *token)

{
  bool bVar1;
  char *format;
  Opcode local_1c [2];
  Opcode opcode;
  
  local_1c[0] = Token::opcode(token);
  bVar1 = Opcode::IsEnabled(local_1c,&this->options_->features);
  if (!bVar1) {
    format = Opcode::GetName(local_1c);
    Error(this,0x101ef60,format);
  }
  return;
}

Assistant:

void WastParser::ErrorUnlessOpcodeEnabled(const Token& token) {
  Opcode opcode = token.opcode();
  if (!opcode.IsEnabled(options_->features)) {
    Error(token.loc, "opcode not allowed: %s", opcode.GetName());
  }
}